

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsets.cpp
# Opt level: O0

void __thiscall icu_63::TailoredSet::comparePrefixes(TailoredSet *this,UChar32 c,UChar *p,UChar *q)

{
  CollationData *pCVar1;
  undefined8 pfx;
  UBool UVar2;
  int8_t iVar3;
  uint32_t uVar4;
  uint32_t baseCE32;
  undefined1 local_188 [4];
  int32_t cmp;
  UnicodeString none;
  UnicodeString *bp;
  UnicodeString *tp;
  undefined1 local_130 [8];
  Iterator basePrefixes;
  ConstChar16Ptr local_a8;
  undefined1 local_a0 [8];
  Iterator prefixes;
  UChar *q_local;
  UChar *p_local;
  UChar32 c_local;
  TailoredSet *this_local;
  
  prefixes.stack_ = (UVector32 *)q;
  ConstChar16Ptr::ConstChar16Ptr(&local_a8,p);
  UCharsTrie::Iterator::Iterator((Iterator *)local_a0,&local_a8,0,&this->errorCode);
  ConstChar16Ptr::~ConstChar16Ptr(&local_a8);
  ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)&tp,(char16_t *)prefixes.stack_);
  UCharsTrie::Iterator::Iterator((Iterator *)local_130,(ConstChar16Ptr *)&tp,0,&this->errorCode);
  ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&tp);
  bp = (UnicodeString *)0x0;
  none.fUnion._48_8_ = 0;
  UnicodeString::UnicodeString((UnicodeString *)local_188,L'\xffff');
  while( true ) {
    if (bp == (UnicodeString *)0x0) {
      UVar2 = UCharsTrie::Iterator::next((Iterator *)local_a0,&this->errorCode);
      if (UVar2 == '\0') {
        bp = (UnicodeString *)local_188;
      }
      else {
        bp = UCharsTrie::Iterator::getString((Iterator *)local_a0);
      }
    }
    if (none.fUnion._48_8_ == 0) {
      UVar2 = UCharsTrie::Iterator::next((Iterator *)local_130,&this->errorCode);
      if (UVar2 == '\0') {
        none.fUnion._48_8_ = local_188;
      }
      else {
        none.fUnion._48_8_ = UCharsTrie::Iterator::getString((Iterator *)local_130);
      }
    }
    if ((bp == (UnicodeString *)local_188) && ((undefined1 *)none.fUnion._48_8_ == local_188))
    break;
    iVar3 = UnicodeString::compare(bp,(UnicodeString *)none.fUnion._48_8_);
    pfx = none.fUnion._48_8_;
    if (iVar3 < '\0') {
      pCVar1 = this->data;
      uVar4 = UCharsTrie::Iterator::getValue((Iterator *)local_a0);
      addPrefix(this,pCVar1,bp,c,uVar4);
      bp = (UnicodeString *)0x0;
    }
    else {
      if (iVar3 < '\x01') {
        setPrefix(this,bp);
        uVar4 = UCharsTrie::Iterator::getValue((Iterator *)local_a0);
        baseCE32 = UCharsTrie::Iterator::getValue((Iterator *)local_130);
        compare(this,c,uVar4,baseCE32);
        resetPrefix(this);
        bp = (UnicodeString *)0x0;
      }
      else {
        pCVar1 = this->baseData;
        uVar4 = UCharsTrie::Iterator::getValue((Iterator *)local_130);
        addPrefix(this,pCVar1,(UnicodeString *)pfx,c,uVar4);
      }
      none.fUnion._48_8_ = 0;
    }
  }
  UnicodeString::~UnicodeString((UnicodeString *)local_188);
  UCharsTrie::Iterator::~Iterator((Iterator *)local_130);
  UCharsTrie::Iterator::~Iterator((Iterator *)local_a0);
  return;
}

Assistant:

void
TailoredSet::comparePrefixes(UChar32 c, const UChar *p, const UChar *q) {
    // Parallel iteration over prefixes of both tables.
    UCharsTrie::Iterator prefixes(p, 0, errorCode);
    UCharsTrie::Iterator basePrefixes(q, 0, errorCode);
    const UnicodeString *tp = NULL;  // Tailoring prefix.
    const UnicodeString *bp = NULL;  // Base prefix.
    // Use a string with a U+FFFF as the limit sentinel.
    // U+FFFF is untailorable and will not occur in prefixes.
    UnicodeString none((UChar)0xffff);
    for(;;) {
        if(tp == NULL) {
            if(prefixes.next(errorCode)) {
                tp = &prefixes.getString();
            } else {
                tp = &none;
            }
        }
        if(bp == NULL) {
            if(basePrefixes.next(errorCode)) {
                bp = &basePrefixes.getString();
            } else {
                bp = &none;
            }
        }
        if(tp == &none && bp == &none) { break; }
        int32_t cmp = tp->compare(*bp);
        if(cmp < 0) {
            // tp occurs in the tailoring but not in the base.
            addPrefix(data, *tp, c, (uint32_t)prefixes.getValue());
            tp = NULL;
        } else if(cmp > 0) {
            // bp occurs in the base but not in the tailoring.
            addPrefix(baseData, *bp, c, (uint32_t)basePrefixes.getValue());
            bp = NULL;
        } else {
            setPrefix(*tp);
            compare(c, (uint32_t)prefixes.getValue(), (uint32_t)basePrefixes.getValue());
            resetPrefix();
            tp = NULL;
            bp = NULL;
        }
    }
}